

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_stage4_avx2(__m256i *x3,__m256i *x4,__m256i *cospi_m32,__m256i *cospi_p32,
                       __m256i *cospi_m16,__m256i *cospi_p48,__m256i *cospi_m48,__m256i *__rounding,
                       int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 (*in_R8) [32];
  undefined1 (*in_R9) [32];
  undefined1 (*in_stack_00000008) [32];
  __m256i in1_w1_9;
  __m256i in0_w0_9;
  __m256i in1_w0_8;
  __m256i in0_w1_8;
  __m256i in1_w1_8;
  __m256i in0_w0_8;
  __m256i in1_w0_7;
  __m256i in0_w1_7;
  __m256i in1_w1_7;
  __m256i in0_w0_7;
  __m256i in1_w0_6;
  __m256i in0_w1_6;
  __m256i in1_w1_6;
  __m256i in0_w0_6;
  __m256i in1_w0_5;
  __m256i in0_w1_5;
  __m256i in1_w1_5;
  __m256i in0_w0_5;
  __m256i in1_w0_4;
  __m256i in0_w1_4;
  __m256i in1_w1_4;
  __m256i in0_w0_4;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  
  auVar1 = vpaddd_avx2(*in_RDI,in_RDI[7]);
  *in_RSI = auVar1;
  auVar1 = vpsubd_avx2(*in_RDI,in_RDI[7]);
  in_RSI[7] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[1],in_RDI[6]);
  in_RSI[1] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[1],in_RDI[6]);
  in_RSI[6] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[2],in_RDI[5]);
  in_RSI[2] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[2],in_RDI[5]);
  in_RSI[5] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[3],in_RDI[4]);
  in_RSI[3] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[3],in_RDI[4]);
  in_RSI[4] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[8] + 8);
  uVar4 = *(undefined8 *)(in_RDI[8] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[8] + 0x18);
  *(undefined8 *)in_RSI[8] = *(undefined8 *)in_RDI[8];
  *(undefined8 *)(in_RSI[8] + 8) = uVar3;
  *(undefined8 *)(in_RSI[8] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[8] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[9] + 8);
  uVar4 = *(undefined8 *)(in_RDI[9] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[9] + 0x18);
  *(undefined8 *)in_RSI[9] = *(undefined8 *)in_RDI[9];
  *(undefined8 *)(in_RSI[9] + 8) = uVar3;
  *(undefined8 *)(in_RSI[9] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[9] + 0x18) = uVar5;
  auVar1 = vpmulld_avx2(in_RDI[10],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0xd],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[10] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[10],(undefined1  [32])*cospi_m48);
  in_RSI[10] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[10],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[10] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[10],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0xd],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0xd] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0xd],(undefined1  [32])*cospi_m48);
  in_RSI[0xd] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0xd],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0xd] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0xb],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0xc],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0xb] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0xb],(undefined1  [32])*cospi_m48);
  in_RSI[0xb] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0xb],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0xb] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0xb],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0xc],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0xc] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0xc],(undefined1  [32])*cospi_m48);
  in_RSI[0xc] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0xc],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0xc] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0xe] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0xe] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0xe] + 0x18);
  *(undefined8 *)in_RSI[0xe] = *(undefined8 *)in_RDI[0xe];
  *(undefined8 *)(in_RSI[0xe] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0xe] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0xe] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0xf] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0xf] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0xf] + 0x18);
  *(undefined8 *)in_RSI[0xf] = *(undefined8 *)in_RDI[0xf];
  *(undefined8 *)(in_RSI[0xf] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0xf] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0xf] + 0x18) = uVar5;
  auVar1 = vpaddd_avx2(in_RDI[0x10],in_RDI[0x17]);
  in_RSI[0x10] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x10],in_RDI[0x17]);
  in_RSI[0x17] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x11],in_RDI[0x16]);
  in_RSI[0x11] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x11],in_RDI[0x16]);
  in_RSI[0x16] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x12],in_RDI[0x15]);
  in_RSI[0x12] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x12],in_RDI[0x15]);
  in_RSI[0x15] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x13],in_RDI[0x14]);
  in_RSI[0x13] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x13],in_RDI[0x14]);
  in_RSI[0x14] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x1f],in_RDI[0x18]);
  in_RSI[0x18] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x1f],in_RDI[0x18]);
  in_RSI[0x1f] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x1e],in_RDI[0x19]);
  in_RSI[0x19] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x1e],in_RDI[0x19]);
  in_RSI[0x1e] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x1d],in_RDI[0x1a]);
  in_RSI[0x1a] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x1d],in_RDI[0x1a]);
  in_RSI[0x1d] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x1c],in_RDI[0x1b]);
  in_RSI[0x1b] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x1c],in_RDI[0x1b]);
  in_RSI[0x1c] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x20] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x20] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x20] + 0x18);
  *(undefined8 *)in_RSI[0x20] = *(undefined8 *)in_RDI[0x20];
  *(undefined8 *)(in_RSI[0x20] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x20] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x20] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x21] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x21] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x21] + 0x18);
  *(undefined8 *)in_RSI[0x21] = *(undefined8 *)in_RDI[0x21];
  *(undefined8 *)(in_RSI[0x21] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x21] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x21] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x22] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x22] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x22] + 0x18);
  *(undefined8 *)in_RSI[0x22] = *(undefined8 *)in_RDI[0x22];
  *(undefined8 *)(in_RSI[0x22] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x22] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x22] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x23] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x23] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x23] + 0x18);
  *(undefined8 *)in_RSI[0x23] = *(undefined8 *)in_RDI[0x23];
  *(undefined8 *)(in_RSI[0x23] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x23] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x23] + 0x18) = uVar5;
  auVar1 = vpmulld_avx2(in_RDI[0x24],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x3b],*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x24] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x24],(undefined1  [32])*cospi_m48);
  in_RSI[0x24] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x24],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x24] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x24],*in_R9);
  auVar2 = vpmulld_avx2(in_RDI[0x3b],*in_R8);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x3b] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x3b],(undefined1  [32])*cospi_m48);
  in_RSI[0x3b] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x3b],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x3b] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x25],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x3a],*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x25] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x25],(undefined1  [32])*cospi_m48);
  in_RSI[0x25] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x25],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x25] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x25],*in_R9);
  auVar2 = vpmulld_avx2(in_RDI[0x3a],*in_R8);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x3a] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x3a],(undefined1  [32])*cospi_m48);
  in_RSI[0x3a] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x3a],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x3a] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x26],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x39],*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x26] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x26],(undefined1  [32])*cospi_m48);
  in_RSI[0x26] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x26],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x26] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x26],*in_R9);
  auVar2 = vpmulld_avx2(in_RDI[0x39],*in_R8);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x39] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x39],(undefined1  [32])*cospi_m48);
  in_RSI[0x39] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x39],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x39] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x27],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x38],*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x27] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x27],(undefined1  [32])*cospi_m48);
  in_RSI[0x27] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x27],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x27] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x27],*in_R9);
  auVar2 = vpmulld_avx2(in_RDI[0x38],*in_R8);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x38] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x38],(undefined1  [32])*cospi_m48);
  in_RSI[0x38] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x38],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x38] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x28],*in_stack_00000008);
  auVar2 = vpmulld_avx2(in_RDI[0x37],*in_R8);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x28] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x28],(undefined1  [32])*cospi_m48);
  in_RSI[0x28] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x28],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x28] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x28],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x37],*in_stack_00000008);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x37] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x37],(undefined1  [32])*cospi_m48);
  in_RSI[0x37] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x37],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x37] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x29],*in_stack_00000008);
  auVar2 = vpmulld_avx2(in_RDI[0x36],*in_R8);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x29] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x29],(undefined1  [32])*cospi_m48);
  in_RSI[0x29] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x29],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x29] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x29],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x36],*in_stack_00000008);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x36] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x36],(undefined1  [32])*cospi_m48);
  in_RSI[0x36] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x36],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x36] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2a],*in_stack_00000008);
  auVar2 = vpmulld_avx2(in_RDI[0x35],*in_R8);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2a] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2a],(undefined1  [32])*cospi_m48);
  in_RSI[0x2a] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2a],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x2a] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2a],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x35],*in_stack_00000008);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x35] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x35],(undefined1  [32])*cospi_m48);
  in_RSI[0x35] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x35],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x35] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2b],*in_stack_00000008);
  auVar2 = vpmulld_avx2(in_RDI[0x34],*in_R8);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2b] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2b],(undefined1  [32])*cospi_m48);
  in_RSI[0x2b] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2b],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x2b] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2b],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0x34],*in_stack_00000008);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x34] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x34],(undefined1  [32])*cospi_m48);
  in_RSI[0x34] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x34],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x34] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x2c] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x2c] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x2c] + 0x18);
  *(undefined8 *)in_RSI[0x2c] = *(undefined8 *)in_RDI[0x2c];
  *(undefined8 *)(in_RSI[0x2c] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x2c] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x2c] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x2d] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x2d] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x2d] + 0x18);
  *(undefined8 *)in_RSI[0x2d] = *(undefined8 *)in_RDI[0x2d];
  *(undefined8 *)(in_RSI[0x2d] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x2d] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x2d] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x2e] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x2e] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x2e] + 0x18);
  *(undefined8 *)in_RSI[0x2e] = *(undefined8 *)in_RDI[0x2e];
  *(undefined8 *)(in_RSI[0x2e] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x2e] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x2e] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x2f] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x2f] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x2f] + 0x18);
  *(undefined8 *)in_RSI[0x2f] = *(undefined8 *)in_RDI[0x2f];
  *(undefined8 *)(in_RSI[0x2f] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x2f] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x2f] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x30] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x30] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x30] + 0x18);
  *(undefined8 *)in_RSI[0x30] = *(undefined8 *)in_RDI[0x30];
  *(undefined8 *)(in_RSI[0x30] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x30] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x30] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x31] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x31] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x31] + 0x18);
  *(undefined8 *)in_RSI[0x31] = *(undefined8 *)in_RDI[0x31];
  *(undefined8 *)(in_RSI[0x31] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x31] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x31] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x32] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x32] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x32] + 0x18);
  *(undefined8 *)in_RSI[0x32] = *(undefined8 *)in_RDI[0x32];
  *(undefined8 *)(in_RSI[0x32] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x32] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x32] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x33] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x33] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x33] + 0x18);
  *(undefined8 *)in_RSI[0x33] = *(undefined8 *)in_RDI[0x33];
  *(undefined8 *)(in_RSI[0x33] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x33] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x33] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3c] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3c] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3c] + 0x18);
  *(undefined8 *)in_RSI[0x3c] = *(undefined8 *)in_RDI[0x3c];
  *(undefined8 *)(in_RSI[0x3c] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3c] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3c] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3d] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3d] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3d] + 0x18);
  *(undefined8 *)in_RSI[0x3d] = *(undefined8 *)in_RDI[0x3d];
  *(undefined8 *)(in_RSI[0x3d] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3d] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3d] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3e] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3e] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3e] + 0x18);
  *(undefined8 *)in_RSI[0x3e] = *(undefined8 *)in_RDI[0x3e];
  *(undefined8 *)(in_RSI[0x3e] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3e] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3e] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3f] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3f] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3f] + 0x18);
  *(undefined8 *)in_RSI[0x3f] = *(undefined8 *)in_RDI[0x3f];
  *(undefined8 *)(in_RSI[0x3f] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3f] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3f] + 0x18) = uVar5;
  return;
}

Assistant:

static inline void fdct64_stage4_avx2(__m256i *x3, __m256i *x4,
                                      __m256i *cospi_m32, __m256i *cospi_p32,
                                      __m256i *cospi_m16, __m256i *cospi_p48,
                                      __m256i *cospi_m48,
                                      const __m256i *__rounding,
                                      int8_t cos_bit) {
  x4[0] = _mm256_add_epi32(x3[0], x3[7]);
  x4[7] = _mm256_sub_epi32(x3[0], x3[7]);
  x4[1] = _mm256_add_epi32(x3[1], x3[6]);
  x4[6] = _mm256_sub_epi32(x3[1], x3[6]);
  x4[2] = _mm256_add_epi32(x3[2], x3[5]);
  x4[5] = _mm256_sub_epi32(x3[2], x3[5]);
  x4[3] = _mm256_add_epi32(x3[3], x3[4]);
  x4[4] = _mm256_sub_epi32(x3[3], x3[4]);
  x4[8] = x3[8];
  x4[9] = x3[9];
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x3[10], x3[13], x4[10], x4[13],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x3[11], x3[12], x4[11], x4[12],
                        *__rounding, cos_bit);
  x4[14] = x3[14];
  x4[15] = x3[15];
  x4[16] = _mm256_add_epi32(x3[16], x3[23]);
  x4[23] = _mm256_sub_epi32(x3[16], x3[23]);
  x4[17] = _mm256_add_epi32(x3[17], x3[22]);
  x4[22] = _mm256_sub_epi32(x3[17], x3[22]);
  x4[18] = _mm256_add_epi32(x3[18], x3[21]);
  x4[21] = _mm256_sub_epi32(x3[18], x3[21]);
  x4[19] = _mm256_add_epi32(x3[19], x3[20]);
  x4[20] = _mm256_sub_epi32(x3[19], x3[20]);
  x4[24] = _mm256_sub_epi32(x3[31], x3[24]);
  x4[31] = _mm256_add_epi32(x3[31], x3[24]);
  x4[25] = _mm256_sub_epi32(x3[30], x3[25]);
  x4[30] = _mm256_add_epi32(x3[30], x3[25]);
  x4[26] = _mm256_sub_epi32(x3[29], x3[26]);
  x4[29] = _mm256_add_epi32(x3[29], x3[26]);
  x4[27] = _mm256_sub_epi32(x3[28], x3[27]);
  x4[28] = _mm256_add_epi32(x3[28], x3[27]);
  x4[32] = x3[32];
  x4[33] = x3[33];
  x4[34] = x3[34];
  x4[35] = x3[35];
  btf_32_type0_avx2_new(*cospi_m16, *cospi_p48, x3[36], x3[59], x4[36], x4[59],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m16, *cospi_p48, x3[37], x3[58], x4[37], x4[58],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m16, *cospi_p48, x3[38], x3[57], x4[38], x4[57],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m16, *cospi_p48, x3[39], x3[56], x4[39], x4[56],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m48, *cospi_m16, x3[40], x3[55], x4[40], x4[55],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m48, *cospi_m16, x3[41], x3[54], x4[41], x4[54],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m48, *cospi_m16, x3[42], x3[53], x4[42], x4[53],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m48, *cospi_m16, x3[43], x3[52], x4[43], x4[52],
                        *__rounding, cos_bit);
  x4[44] = x3[44];
  x4[45] = x3[45];
  x4[46] = x3[46];
  x4[47] = x3[47];
  x4[48] = x3[48];
  x4[49] = x3[49];
  x4[50] = x3[50];
  x4[51] = x3[51];
  x4[60] = x3[60];
  x4[61] = x3[61];
  x4[62] = x3[62];
  x4[63] = x3[63];
}